

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::flush_on(registry *this,level_enum log_level)

{
  __node_base *p_Var1;
  
  CLI::std::mutex::lock((mutex *)this);
  p_Var1 = &(this->loggers_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    LOCK();
    *(level_enum *)((long)&p_Var1[5]._M_nxt[8]._M_nxt + 4) = log_level;
    UNLOCK();
  }
  this->flush_level_ = log_level;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::flush_on(level::level_enum log_level) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_) {
        l.second->flush_on(log_level);
    }
    flush_level_ = log_level;
}